

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

bool __thiscall soul::heart::Function::mayHaveSideEffects(Function *this)

{
  pointer ppVar1;
  int iVar2;
  Statement *pSVar3;
  pool_ref<soul::heart::Block> *b;
  pointer ppVar4;
  Iterator __begin3;
  Iterator local_20;
  
  ppVar1 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    local_20.object = (ppVar4->object->statements).firstObject;
    while (local_20.object != (Statement *)0x0) {
      pSVar3 = LinkedList<soul::heart::Statement>::Iterator::operator*(&local_20);
      iVar2 = (*(pSVar3->super_Object)._vptr_Object[5])(pSVar3);
      if ((char)iVar2 != '\0') goto LAB_0023b66a;
      LinkedList<soul::heart::Statement>::Iterator::operator++(&local_20);
    }
  }
LAB_0023b66a:
  return ppVar4 != ppVar1;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn)
        {
            for (auto p : parameters)
                p->visitExpressions (fn, AccessType::read);

            for (auto s : statements)
                s->visitExpressions (fn);

            if (terminator != nullptr)
                terminator->visitExpressions (fn);
        }